

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O0

bool __thiscall ON_Buffer::Compress(ON_Buffer *this,ON_Buffer *compressed_buffer)

{
  byte bVar1;
  bool bVar2;
  ON__UINT32 OVar3;
  ON__UINT32 OVar4;
  ON__UINT64 OVar5;
  ON__UINT64 OVar6;
  ulong local_d0;
  ON_Buffer *local_c0;
  ON__UINT64 pos1;
  ON_BUFFER_SEGMENT *seg;
  ON_BUFFER_SEGMENT *prev_seg;
  ON__UINT64 uncompressed_size;
  ON_Buffer *out;
  ON_CompressStream compressor;
  bool rc;
  ON_Buffer *compressed_buffer_local;
  ON_Buffer *this_local;
  
  compressor.m_reserved._7_1_ = 0;
  ON_CompressStream::ON_CompressStream((ON_CompressStream *)&out);
  local_c0 = compressed_buffer;
  if (this == compressed_buffer) {
    local_c0 = (ON_Buffer *)operator_new(0x40);
    ON_Buffer(local_c0);
  }
  Destroy(local_c0);
  OVar5 = Size(this);
  if (((OVar5 != 0) &&
      (bVar2 = ON_CompressStream::SetCallback
                         ((ON_CompressStream *)&out,ON_Buffer_StreamCallback,local_c0), bVar2)) &&
     (bVar2 = ON_CompressStream::Begin((ON_CompressStream *)&out), bVar2)) {
    seg = (ON_BUFFER_SEGMENT *)0x0;
    for (pos1 = (ON__UINT64)this->m_first_segment; pos1 != 0; pos1 = *(ON__UINT64 *)(pos1 + 8)) {
      local_d0 = OVar5;
      if (*(ulong *)(pos1 + 0x18) <= OVar5) {
        local_d0 = *(ulong *)(pos1 + 0x18);
      }
      if ((local_d0 < *(ulong *)(pos1 + 0x10)) || (seg != *(ON_BUFFER_SEGMENT **)pos1)) break;
      if (seg == (ON_BUFFER_SEGMENT *)0x0) {
        if (*(long *)(pos1 + 0x10) != 0) break;
      }
      else if (seg->m_segment_position1 != *(ON__UINT64 *)(pos1 + 0x10)) break;
      bVar2 = ON_CompressStream::In
                        ((ON_CompressStream *)&out,local_d0 - *(long *)(pos1 + 0x10),
                         *(void **)(pos1 + 0x20));
      if (!bVar2) break;
      seg = (ON_BUFFER_SEGMENT *)pos1;
    }
    if (((pos1 == 0) && (bVar2 = ON_CompressStream::End((ON_CompressStream *)&out), bVar2)) &&
       (OVar6 = ON_CompressStream::InSize((ON_CompressStream *)&out), OVar6 == OVar5)) {
      OVar3 = ON_CompressStream::InCRC((ON_CompressStream *)&out);
      OVar4 = CRC32(this,0);
      if (OVar3 == OVar4) {
        OVar5 = ON_CompressStream::OutSize((ON_CompressStream *)&out);
        OVar6 = Size(local_c0);
        if (OVar5 == OVar6) {
          OVar3 = ON_CompressStream::OutCRC((ON_CompressStream *)&out);
          OVar4 = CRC32(local_c0,0);
          if (OVar3 == OVar4) {
            compressor.m_reserved._7_1_ = 1;
          }
        }
      }
    }
  }
  if ((compressor.m_reserved._7_1_ & 1) == 0) {
    Destroy(local_c0);
    if ((this == compressed_buffer) && (local_c0 != (ON_Buffer *)0x0)) {
      ~ON_Buffer(local_c0);
      operator_delete(local_c0,0x40);
    }
  }
  else {
    Compact(local_c0);
    local_c0->m_current_position = 0;
    local_c0->m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
    if (this == compressed_buffer) {
      Destroy(compressed_buffer);
      compressed_buffer->m_buffer_size = local_c0->m_buffer_size;
      compressed_buffer->m_current_position = local_c0->m_current_position;
      compressed_buffer->m_first_segment = local_c0->m_first_segment;
      compressed_buffer->m_last_segment = local_c0->m_last_segment;
      compressed_buffer->m_current_segment = local_c0->m_current_segment;
      compressed_buffer->m_error_handler = local_c0->m_error_handler;
      compressed_buffer->m_last_error = local_c0->m_last_error;
      local_c0->m_first_segment = (ON_BUFFER_SEGMENT *)0x0;
      local_c0->m_last_segment = (ON_BUFFER_SEGMENT *)0x0;
      local_c0->m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
      local_c0->m_buffer_size = 0;
      if (local_c0 != (ON_Buffer *)0x0) {
        ~ON_Buffer(local_c0);
        operator_delete(local_c0,0x40);
      }
    }
  }
  bVar1 = compressor.m_reserved._7_1_;
  ON_CompressStream::~ON_CompressStream((ON_CompressStream *)&out);
  return (bool)(bVar1 & 1);
}

Assistant:

bool ON_Buffer::Compress( ON_Buffer& compressed_buffer ) const
{
  bool rc = false;
  ON_CompressStream compressor;
  ON_Buffer* out = ( this == &compressed_buffer ) ? new ON_Buffer() : &compressed_buffer;

  out->Destroy();

  for (;;)
  {
    ON__UINT64 uncompressed_size = Size();
    if ( uncompressed_size <= 0 )
      break;
    if ( !compressor.SetCallback(ON_Buffer_StreamCallback,out) )
      break;
    if ( !compressor.Begin() )
      break;

    struct ON_BUFFER_SEGMENT* prev_seg = 0;
    struct ON_BUFFER_SEGMENT* seg = 0;
    for ( seg = m_first_segment; 0 != seg; seg = seg->m_next_segment )
    {
      const ON__UINT64 pos1 = (uncompressed_size < seg->m_segment_position1)
                            ? uncompressed_size 
                            : seg->m_segment_position1;
      if ( pos1 < seg->m_segment_position0 )
        break;
      if ( prev_seg != seg->m_prev_segment )
        break;
      if ( 0 == prev_seg )
      {
        if ( 0 != seg->m_segment_position0 )
          break;
      }
      else
      {
        if ( prev_seg->m_segment_position1 != seg->m_segment_position0 )
          break;
      }
      if ( !compressor.In(pos1 - seg->m_segment_position0,seg->m_segment_buffer) )
        break;
      prev_seg = seg;
    }
    if ( 0 != seg )
      break;

    if ( !compressor.End() )
      break;

    if ( compressor.InSize() != uncompressed_size )
      break;
    if ( compressor.InCRC() != CRC32(0) )
      break;
    if ( compressor.OutSize() != out->Size() )
      break;
    if ( compressor.OutCRC() != out->CRC32(0) )
      break;

    rc = true;
    break;
  }

  if ( !rc )
  {
    out->Destroy();
    if ( this == &compressed_buffer )
      delete out;
  }
  else
  {
    out->Compact();
    out->m_current_position = 0;
    out->m_current_segment = 0;
    if ( this == &compressed_buffer )
    {
      // transfer "out" to "this"
      compressed_buffer.Destroy();
      compressed_buffer.m_buffer_size = out->m_buffer_size;
      compressed_buffer.m_current_position = out->m_current_position;
      compressed_buffer.m_first_segment = out->m_first_segment;
      compressed_buffer.m_last_segment = out->m_last_segment;
      compressed_buffer.m_current_segment = out->m_current_segment;
      compressed_buffer.m_error_handler = out->m_error_handler;
      compressed_buffer.m_last_error = out->m_last_error;
      
      out->m_first_segment = 0;
      out->m_last_segment = 0;
      out->m_current_segment = 0;
      out->m_buffer_size = 0;
      delete out;
    }
  }

  return rc;
}